

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

_Bool quest_check(player *p,monster *m)

{
  bool bVar1;
  int local_28;
  int iStack_24;
  _Bool completed;
  wchar_t total;
  wchar_t i;
  monster *m_local;
  player *p_local;
  
  local_28 = 0;
  bVar1 = false;
  for (iStack_24 = 0; iStack_24 < (int)(uint)z_info->quest_max; iStack_24 = iStack_24 + 1) {
    if (((cave->depth == (uint)p->quests[iStack_24].level) && (m->race == p->quests[iStack_24].race)
        ) && (p->quests[iStack_24].cur_num = p->quests[iStack_24].cur_num + L'\x01',
             p->quests[iStack_24].cur_num == p->quests[iStack_24].max_num)) {
      p->quests[iStack_24].level = '\0';
      bVar1 = true;
    }
    if (p->quests[iStack_24].level != '\0') {
      local_28 = local_28 + 1;
    }
  }
  if (bVar1) {
    build_quest_stairs(p,(loc)m->grid);
    if (local_28 == 0) {
      p->total_winner = 1;
      p->upkeep->redraw = p->upkeep->redraw | 2;
      msg("*** CONGRATULATIONS ***");
      msg("You have won the game!");
      msg("You may retire (key is shift-q) when you are ready.");
    }
    p_local._7_1_ = true;
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool quest_check(struct player *p, const struct monster *m)
{
	int i, total = 0;
	bool completed = false;

	/* Mark quests as complete */
	for (i = 0; i < z_info->quest_max; i++) {
		/* Note completed quests */
		if (cave->depth == p->quests[i].level &&
		    m->race == p->quests[i].race) {
			p->quests[i].cur_num++;

			if (p->quests[i].cur_num == p->quests[i].max_num) {
				p->quests[i].level = 0;
				completed = true;
			}
		}

		/* Count incomplete quests */
		if (p->quests[i].level) total++;
	}

	if (completed) {
		/* Build magical stairs */
		build_quest_stairs(p, m->grid);

		/* Nothing left, game over... */
		if (total == 0) {
			p->total_winner = true;
			p->upkeep->redraw |= (PR_TITLE);
			msg("*** CONGRATULATIONS ***");
			msg("You have won the game!");
			msg("You may retire (key is shift-q) when you are ready.");
		}

		return true;
	} else {
		return false;
	}
}